

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes SzArEx_Extract(CSzArEx *p,ILookInStream *inStream,UInt32 fileIndex,UInt32 *blockIndex,
                   Byte **tempBuf,size_t *outBufferSize,size_t *offset,size_t *outSizeProcessed,
                   ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  uint folderIndex;
  UInt64 *pUVar1;
  UInt64 UVar2;
  int iVar3;
  UInt32 UVar4;
  Byte *pBVar5;
  size_t sVar6;
  ulong uVar7;
  
  folderIndex = p->FileToFolder[fileIndex];
  uVar7 = (ulong)folderIndex;
  *offset = 0;
  *outSizeProcessed = 0;
  if (uVar7 == 0xffffffff) {
    (*allocMain->Free)(allocMain,*tempBuf);
    *blockIndex = 0xffffffff;
    *tempBuf = (Byte *)0x0;
    *outBufferSize = 0;
    return 0;
  }
  pBVar5 = *tempBuf;
  if ((pBVar5 != (Byte *)0x0) && (*blockIndex == folderIndex)) goto LAB_0059ab7d;
  sVar6 = (p->db).CoderUnpackSizes
          [(uint)(p->db).FoToMainUnpackSizeIndex[uVar7] + (p->db).FoToCoderUnpackSizes[uVar7]];
  *blockIndex = folderIndex;
  (*allocMain->Free)(allocMain,pBVar5);
  *tempBuf = (Byte *)0x0;
  *outBufferSize = sVar6;
  if (sVar6 == 0) {
    pBVar5 = (Byte *)0x0;
LAB_0059ab3d:
    iVar3 = SzAr_DecodeFolder(&p->db,folderIndex,inStream,p->dataPos,pBVar5,sVar6,allocTemp);
  }
  else {
    pBVar5 = (Byte *)(*allocMain->Alloc)(allocMain,sVar6);
    *tempBuf = pBVar5;
    if (pBVar5 != (Byte *)0x0) goto LAB_0059ab3d;
    iVar3 = 2;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
LAB_0059ab7d:
  pUVar1 = p->UnpackPositions;
  UVar2 = pUVar1[fileIndex];
  *offset = UVar2 - pUVar1[p->FolderToFile[uVar7]];
  sVar6 = pUVar1[fileIndex + 1] - UVar2;
  *outSizeProcessed = sVar6;
  if (*outBufferSize < *offset + sVar6) {
    iVar3 = 0xb;
  }
  else {
    pBVar5 = (p->CRCs).Defs;
    iVar3 = 0;
    if ((pBVar5 != (Byte *)0x0) && ((char)(pBVar5[fileIndex >> 3] << ((byte)fileIndex & 7)) < '\0'))
    {
      UVar4 = CrcCalc(*tempBuf + *offset,sVar6);
      iVar3 = (uint)(UVar4 != (p->CRCs).Vals[fileIndex]) * 3;
    }
  }
  return iVar3;
}

Assistant:

SRes SzArEx_Extract(
    const CSzArEx *p,
    ILookInStream *inStream,
    UInt32 fileIndex,
    UInt32 *blockIndex,
    Byte **tempBuf,
    size_t *outBufferSize,
    size_t *offset,
    size_t *outSizeProcessed,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 folderIndex = p->FileToFolder[fileIndex];
  SRes res = SZ_OK;
  
  *offset = 0;
  *outSizeProcessed = 0;
  
  if (folderIndex == (UInt32)-1)
  {
    IAlloc_Free(allocMain, *tempBuf);
    *blockIndex = folderIndex;
    *tempBuf = NULL;
    *outBufferSize = 0;
    return SZ_OK;
  }

  if (*tempBuf == NULL || *blockIndex != folderIndex)
  {
    UInt64 unpackSizeSpec = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
    /*
    UInt64 unpackSizeSpec =
        p->UnpackPositions[p->FolderToFile[folderIndex + 1]] -
        p->UnpackPositions[p->FolderToFile[folderIndex]];
    */
    size_t unpackSize = (size_t)unpackSizeSpec;

    if (unpackSize != unpackSizeSpec)
      return SZ_ERROR_MEM;
    *blockIndex = folderIndex;
    IAlloc_Free(allocMain, *tempBuf);
    *tempBuf = NULL;
    
    if (res == SZ_OK)
    {
      *outBufferSize = unpackSize;
      if (unpackSize != 0)
      {
        *tempBuf = (Byte *)IAlloc_Alloc(allocMain, unpackSize);
        if (*tempBuf == NULL)
          res = SZ_ERROR_MEM;
      }
  
      if (res == SZ_OK)
      {
        res = SzAr_DecodeFolder(&p->db, folderIndex,
            inStream, p->dataPos, *tempBuf, unpackSize, allocTemp);
      }
    }
  }

  if (res == SZ_OK)
  {
    UInt64 unpackPos = p->UnpackPositions[fileIndex];
    *offset = (size_t)(unpackPos - p->UnpackPositions[p->FolderToFile[folderIndex]]);
    *outSizeProcessed = (size_t)(p->UnpackPositions[fileIndex + 1] - unpackPos);
    if (*offset + *outSizeProcessed > *outBufferSize)
      return SZ_ERROR_FAIL;
    if (SzBitWithVals_Check(&p->CRCs, fileIndex))
      if (CrcCalc(*tempBuf + *offset, *outSizeProcessed) != p->CRCs.Vals[fileIndex])
        res = SZ_ERROR_CRC;
  }

  return res;
}